

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O1

int libj1939_open_socket(void)

{
  int iVar1;
  undefined4 local_c;
  
  iVar1 = socket(0x1d,2,7);
  if (iVar1 < 0) {
    libj1939_open_socket_cold_1();
    iVar1 = local_c;
  }
  return iVar1;
}

Assistant:

int libj1939_open_socket(void)
{
	int ret;

	/* Create a new CAN J1939 socket */
	ret = socket(PF_CAN, SOCK_DGRAM, CAN_J1939);
	if (ret < 0) {
		/* Get the error code and print an error message */
		ret = -errno;
		pr_err("socket(j1939): %d (%s)", ret, strerror(ret));
		return ret;
	}
	return ret;
}